

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::MergeFrom
          (CategoricalDistributionLayerParams *this,CategoricalDistributionLayerParams *from)

{
  float fVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xeabe);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from->seed_ != 0) {
    this->seed_ = from->seed_;
  }
  if (from->numsamples_ != 0) {
    this->numsamples_ = from->numsamples_;
  }
  if (from->islogits_ == true) {
    this->islogits_ = true;
  }
  fVar1 = from->eps_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->eps_ = fVar1;
  }
  fVar1 = from->temperature_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->temperature_ = fVar1;
  }
  return;
}

Assistant:

void CategoricalDistributionLayerParams::MergeFrom(const CategoricalDistributionLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CategoricalDistributionLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.seed() != 0) {
    set_seed(from.seed());
  }
  if (from.numsamples() != 0) {
    set_numsamples(from.numsamples());
  }
  if (from.islogits() != 0) {
    set_islogits(from.islogits());
  }
  if (from.eps() != 0) {
    set_eps(from.eps());
  }
  if (from.temperature() != 0) {
    set_temperature(from.temperature());
  }
}